

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

Split * wasm::String::handleBracketingOperators(Split *__return_storage_ptr__,Split *split)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pbVar3;
  Fatal local_240;
  undefined1 local_b8 [8];
  anon_class_24_3_616f249e handlePart;
  undefined1 local_90 [16];
  undefined1 local_80 [32];
  size_type *local_60;
  string last;
  int local_34 [2];
  int nesting;
  
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60 = &last._M_string_length;
  last._M_dataplus._M_p = (pointer)0x0;
  last._M_string_length._0_1_ = 0;
  local_b8 = (undefined1  [8])local_34;
  local_34[0] = 0;
  handlePart.nesting = (int *)&local_60;
  pbVar3 = (split->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (split->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  handlePart.last = (string *)__return_storage_ptr__;
  last.field_2._8_8_ = __return_storage_ptr__;
  if (pbVar3 != pbVar1) {
    do {
      pcVar2 = (pbVar3->_M_dataplus)._M_p;
      handlePart.ret = (Split *)local_90;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&handlePart.ret,pcVar2,pcVar2 + pbVar3->_M_string_length);
      handleBracketingOperators::anon_class_24_3_616f249e::operator()
                ((anon_class_24_3_616f249e *)local_b8,(string *)&handlePart.ret);
      if (handlePart.ret != (Split *)local_90) {
        operator_delete(handlePart.ret,(ulong)((long)&((_Alloc_hider *)local_90._0_8_)->_M_p + 1));
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar1);
  }
  local_80._0_8_ = (pointer)(local_80 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"");
  handleBracketingOperators::anon_class_24_3_616f249e::operator()
            ((anon_class_24_3_616f249e *)local_b8,(string *)local_80);
  if ((pointer)local_80._0_8_ != (pointer)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if (local_34[0] == 0) {
    if (local_60 != &last._M_string_length) {
      operator_delete(local_60,CONCAT71(last._M_string_length._1_7_,
                                        (undefined1)last._M_string_length) + 1);
    }
    return (Split *)last.field_2._8_8_;
  }
  Fatal::Fatal(&local_240);
  Fatal::operator<<(&local_240,(char (*) [32])"Asyncify: failed to parse lists");
  Fatal::~Fatal(&local_240);
}

Assistant:

inline String::Split handleBracketingOperators(String::Split split) {
  String::Split ret;
  std::string last;
  int nesting = 0;
  auto handlePart = [&](std::string part) {
    if (part.empty()) {
      return;
    }
    for (const char c : part) {
      if (c == '(' || c == '<' || c == '[' || c == '{') {
        nesting++;
      } else if (c == ')' || c == '>' || c == ']' || c == '}') {
        nesting--;
      }
    }
    if (last.empty()) {
      last = part;
    } else {
      last += ',' + part;
    }
    if (nesting == 0) {
      ret.push_back(last);
      last.clear();
    }
  };
  for (auto& part : split) {
    handlePart(part);
  }
  handlePart("");
  if (nesting != 0) {
    Fatal() << "Asyncify: failed to parse lists";
  }
  return ret;
}